

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Players.cpp
# Opt level: O2

void Handlers::Players_List(EOClient *client,PacketReader *reader)

{
  uint uVar1;
  _List_node_base *p_Var2;
  Character *character;
  bool bVar3;
  PacketAction PVar4;
  int iVar5;
  mapped_type *pmVar6;
  long lVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  char cVar10;
  iterator __begin1;
  iterator __end1;
  bool bVar11;
  PacketBuilder reply;
  Character *from_character;
  int seehide;
  string hidden_admin_suffix;
  string name_suffix;
  int cmdprotect;
  anon_class_24_3_cad2cfe9 really_hidden;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (client->player == (Player *)0x0) {
    from_character = (Character *)0x0;
  }
  else {
    from_character = client->player->character;
  }
  p_Var2 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reply,"seehide",(allocator<char> *)&hidden_admin_suffix);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(p_Var2 + 0x1f),(key_type *)&reply);
  iVar5 = util::variant::GetInt(pmVar6);
  std::__cxx11::string::~string((string *)&reply);
  p_Var2 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  seehide = iVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reply,"cmdprotect",(allocator<char> *)&hidden_admin_suffix);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(p_Var2 + 0x1f),(key_type *)&reply);
  iVar5 = util::variant::GetInt(pmVar6);
  std::__cxx11::string::~string((string *)&reply);
  really_hidden.cmdprotect = &cmdprotect;
  really_hidden.from_character = &from_character;
  really_hidden.seehide = &seehide;
  p_Var2 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  cmdprotect = iVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reply,"SLN",(allocator<char> *)&name_suffix);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&p_Var2[0x19]._M_prev,(key_type *)&reply);
  bVar3 = util::variant::GetBool(pmVar6);
  if (bVar3) {
    std::__cxx11::string::~string((string *)&reply);
  }
  else {
    p_Var2 = (client->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&hidden_admin_suffix,"AllowStats",(allocator<char> *)&local_70);
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&p_Var2[0x19]._M_prev,&hidden_admin_suffix);
    bVar3 = util::variant::GetBool(pmVar6);
    bVar11 = from_character == (Character *)0x0;
    std::__cxx11::string::~string((string *)&hidden_admin_suffix);
    std::__cxx11::string::~string((string *)&reply);
    if (!bVar3 && bVar11) {
      return;
    }
  }
  p_Var2 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  p_Var9 = p_Var2[0x49]._M_prev;
  p_Var2 = p_Var2[0x4a]._M_next;
  uVar8 = (ulong)((long)p_Var2 - (long)p_Var9) >> 3;
  for (; iVar5 = (int)uVar8, p_Var9 != p_Var2; p_Var9 = (_List_node_base *)&p_Var9->_M_prev) {
    if ((((Character *)p_Var9->_M_next)->hidden & 2) != 0) {
      bVar3 = Players_List::anon_class_24_3_cad2cfe9::operator()
                        (&really_hidden,(Character *)p_Var9->_M_next);
      uVar8 = (ulong)(iVar5 - (uint)bVar3);
    }
  }
  PVar4 = PacketReader::Action(reader);
  p_Var2 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reply,"hidden_admin_suffix",(allocator<char> *)&name_suffix);
  I18N::Format<>(&hidden_admin_suffix,(I18N *)(p_Var2 + 0x49),(string *)&reply);
  std::__cxx11::string::~string((string *)&reply);
  lVar7 = 0xd;
  if (PVar4 != PACKET_LIST) {
    lVar7 = hidden_admin_suffix._M_string_length + 0x24;
  }
  PacketBuilder::PacketBuilder(&reply,PACKET_F_INIT,PACKET_A_INIT,lVar7 * iVar5 + 4);
  PacketBuilder::AddChar(&reply,(uint)(PVar4 == PACKET_LIST) * 2 + 8);
  PacketBuilder::AddShort(&reply,iVar5);
  PacketBuilder::AddByte(&reply,0xff);
  p_Var2 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  p_Var9 = p_Var2[0x49]._M_prev;
  p_Var2 = p_Var2[0x4a]._M_next;
  do {
    if (p_Var9 == p_Var2) {
      EOClient::Send(client,&reply);
      PacketBuilder::~PacketBuilder(&reply);
      std::__cxx11::string::~string((string *)&hidden_admin_suffix);
      return;
    }
    character = (Character *)p_Var9->_M_next;
    uVar1 = character->hidden;
    name_suffix._M_string_length = 0;
    name_suffix._M_dataplus._M_p = (pointer)&name_suffix.field_2;
    name_suffix.field_2._M_local_buf[0] = '\0';
    if ((uVar1 & 2) == 0) {
LAB_0014df48:
      (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_50,character);
      std::operator+(&local_70,&local_50,&name_suffix);
      PacketBuilder::AddBreakString(&reply,&local_70,0xff);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if (PVar4 == PACKET_LIST) {
        (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_70,character);
        PacketBuilder::AddBreakString(&reply,&local_70,0xff);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        PacketBuilder::AddBreakString(&reply,&character->title,0xff);
        PacketBuilder::AddChar(&reply,0);
        if ((character->bot != true) || (iVar5 = 0x14, from_character != (Character *)0x0)) {
          cVar10 = (char)((uVar1 & 8) >> 3);
          if (character->admin < ADMIN_HGM || cVar10 != '\0') {
            if (character->admin == ADMIN_PLAYER || cVar10 != '\0') {
              iVar5 = 6;
              if (character->party == (Party *)0x0) {
                iVar5 = 0;
              }
            }
            else {
              iVar5 = (uint)(character->party != (Party *)0x0) * 5 + 4;
            }
          }
          else {
            iVar5 = (uint)(character->party != (Party *)0x0) * 5 + 5;
          }
        }
        PacketBuilder::AddChar(&reply,iVar5);
        PacketBuilder::AddChar(&reply,(uint)character->clas);
        Character::PaddedGuildTag_abi_cxx11_(&local_70,character);
        PacketBuilder::AddString(&reply,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        PacketBuilder::AddByte(&reply,0xff);
      }
    }
    else {
      bVar3 = Players_List::anon_class_24_3_cad2cfe9::operator()(&really_hidden,character);
      if (!bVar3) {
        std::operator+(&local_70," ",&hidden_admin_suffix);
        std::__cxx11::string::operator=((string *)&name_suffix,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_0014df48;
      }
    }
    std::__cxx11::string::~string((string *)&name_suffix);
    p_Var9 = (_List_node_base *)&p_Var9->_M_prev;
  } while( true );
}

Assistant:

void Players_List(EOClient *client, PacketReader &reader)
{
	Player* from_player = client->player;
	Character* from_character = from_player ? from_player->character : nullptr;
	int seehide = client->server()->world->admin_config["seehide"];
	int cmdprotect = client->server()->world->admin_config["cmdprotect"];

	auto really_hidden = [&](const Character* character)
	{
		return !(from_character && (
		       from_character == character
		    || (from_character->admin >= seehide && character->admin < cmdprotect)
		    || (from_character->admin >= seehide && character->admin >= cmdprotect && from_character->admin > character->admin)
		));
	};

	if (!client->server()->world->config["SLN"] && !client->server()->world->config["AllowStats"] && !from_character)
	{
		return;
	}

	int online = client->server()->world->characters.size();

	UTIL_FOREACH(client->server()->world->characters, character)
	{
		bool hide_online = character->IsHideOnline();

		if (hide_online && really_hidden(character))
			--online;
	}

	bool is_friends_list = (reader.Action() == PACKET_LIST);
	std::string hidden_admin_suffix = client->server()->world->i18n.Format("hidden_admin_suffix");

	PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 4 + online * (is_friends_list ? 13 : (36 + hidden_admin_suffix.length())));
	reply.AddChar(is_friends_list ? INIT_FRIEND_LIST_PLAYERS : INIT_PLAYERS);
	reply.AddShort(online);
	reply.AddByte(255);
	UTIL_FOREACH(client->server()->world->characters, character)
	{
		bool hide_online = character->IsHideOnline();
		bool hide_admin = character->IsHideAdmin();

		std::string name_suffix;

		if (hide_online && really_hidden(character))
			continue;

		if (hide_online)
			name_suffix = " " + hidden_admin_suffix;

		reply.AddBreakString(character->SourceName() + name_suffix);

		// Full information is not sent for friends list requests
		if (!is_friends_list)
		{
			reply.AddBreakString(character->title);
			reply.AddChar(0); // ?
			if (character->bot && !from_character)
			{
				reply.AddChar(ICON_SLN_BOT);
			}
			else if (character->admin >= ADMIN_HGM && !hide_admin)
			{
				if (character->party)
				{
					reply.AddChar(ICON_HGM_PARTY);
				}
				else
				{
					reply.AddChar(ICON_HGM);
				}
			}
			else if (character->admin >= ADMIN_GUIDE && !hide_admin)
			{
				if (character->party)
				{
					reply.AddChar(ICON_GM_PARTY);
				}
				else
				{
					reply.AddChar(ICON_GM);
				}
			}
			else
			{
				if (character->party)
				{
					reply.AddChar(ICON_PARTY);
				}
				else
				{
					reply.AddChar(ICON_NORMAL);
				}
			}
			reply.AddChar(character->clas);
			reply.AddString(character->PaddedGuildTag());
			reply.AddByte(255);
		}
		else
		{
			reply.AddBreakString(character->SourceName());
		}
	}

	client->Send(reply);
}